

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O2

void __thiscall
irr::gui::CGUIFileOpenDialog::CGUIFileOpenDialog
          (CGUIFileOpenDialog *this,wchar_t *title,IGUIEnvironment *environment,IGUIElement *parent,
          s32 id,bool restoreCWD,char_type *startDir)

{
  code *pcVar1;
  vector2d<int> vVar2;
  vector2d<int> vVar3;
  _func_int **pp_Var4;
  long *plVar5;
  rect<int> rectangle;
  int iVar6;
  uint uVar7;
  int iVar8;
  IFileSystem *pIVar9;
  undefined4 extraout_var;
  long *plVar10;
  long lVar11;
  wchar_t *pwVar12;
  IGUIButton *pIVar13;
  IGUIListBox *pIVar14;
  IGUIEditBox *pIVar15;
  IGUIElement *this_00;
  ulong uVar16;
  string<char> local_60;
  int local_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  
  *(undefined ***)&this->field_0x268 = &PTR__IReferenceCounted_0027ba48;
  *(undefined8 *)&this->field_0x270 = 0;
  *(undefined4 *)&this->field_0x278 = 1;
  vVar2 = (parent->AbsoluteRect).UpperLeftCorner;
  vVar3 = (parent->AbsoluteRect).LowerRightCorner;
  iVar8 = 2;
  local_40 = ((vVar3.X - vVar2.X) + -0x15e) / 2;
  iStack_3c = ((vVar3.Y - vVar2.Y) + -0xfa) / 2;
  iStack_38 = local_40 + 0x15e;
  iStack_34 = iStack_3c + 0xfa;
  rectangle.UpperLeftCorner.Y = iStack_3c;
  rectangle.UpperLeftCorner.X = local_40;
  rectangle.LowerRightCorner.Y = iStack_34;
  rectangle.LowerRightCorner.X = iStack_38;
  IGUIFileOpenDialog::IGUIFileOpenDialog
            ((IGUIFileOpenDialog *)this,&PTR_construction_vtable_24__0028b588,environment,parent,id,
             rectangle);
  *(undefined8 *)this = 0x28b418;
  *(undefined8 *)&this->field_0x268 = 0x28b570;
  (this->DragStart).X = 0;
  (this->DragStart).Y = 0;
  (this->FileName).str._M_dataplus._M_p = (pointer)&(this->FileName).str.field_2;
  (this->FileName).str._M_string_length = 0;
  (this->FileName).str.field_2._M_local_buf[0] = '\0';
  (this->FileNameW).str._M_dataplus._M_p = (pointer)&(this->FileNameW).str.field_2;
  (this->FileNameW).str._M_string_length = 0;
  (this->FileNameW).str.field_2._M_local_buf[0] = L'\0';
  (this->FileDirectory).str._M_dataplus._M_p = (pointer)&(this->FileDirectory).str.field_2;
  (this->FileDirectory).str._M_string_length = 0;
  (this->FileDirectory).str.field_2._M_local_buf[0] = '\0';
  (this->FileDirectoryFlat).str._M_dataplus._M_p = (pointer)&(this->FileDirectoryFlat).str.field_2;
  (this->FileDirectoryFlat).str._M_string_length = 0;
  (this->FileDirectoryFlat).str.field_2._M_local_buf[0] = '\0';
  (this->FileDirectoryFlatW).str._M_dataplus._M_p = (pointer)&(this->FileDirectoryFlatW).str.field_2
  ;
  (this->FileDirectoryFlatW).str._M_string_length = 0;
  (this->FileDirectoryFlatW).str.field_2._M_local_buf[0] = L'\0';
  (this->RestoreDirectory).str._M_dataplus._M_p = (pointer)&(this->RestoreDirectory).str.field_2;
  (this->RestoreDirectory).str._M_string_length = 0;
  (this->RestoreDirectory).str.field_2._M_local_buf[0] = '\0';
  (this->StartDirectory).str._M_dataplus._M_p = (pointer)&(this->StartDirectory).str.field_2;
  (this->StartDirectory).str._M_string_length = 0;
  (this->StartDirectory).str.field_2._M_local_buf[0] = '\0';
  this->FileNameText = (IGUIEditBox *)0x0;
  this->FileList = (IFileList *)0x0;
  this->Dragging = false;
  core::string<wchar_t>::operator=((string<wchar_t> *)&this->field_0xa8,title);
  if (*(long **)&this->field_0x128 == (long *)0x0) {
    this->FileSystem = (IFileSystem *)0x0;
  }
  else {
    pIVar9 = (IFileSystem *)(**(code **)(**(long **)&this->field_0x128 + 0x38))();
    this->FileSystem = pIVar9;
    if (pIVar9 != (IFileSystem *)0x0) {
      pp_Var4 = pIVar9->_vptr_IFileSystem;
      *(int *)(&pIVar9->field_0x10 + (long)pp_Var4[-3]) =
           *(int *)(&pIVar9->field_0x10 + (long)pp_Var4[-3]) + 1;
      if (restoreCWD) {
        iVar6 = (*pp_Var4[0x11])(pIVar9);
        core::string<char>::operator=
                  (&this->RestoreDirectory,(string<char> *)CONCAT44(extraout_var,iVar6));
      }
      if (startDir != (char_type *)0x0) {
        core::string<char>::operator=(&this->StartDirectory,startDir);
        pIVar9 = this->FileSystem;
        core::string<char>::string<char>(&local_60,startDir);
        (*pIVar9->_vptr_IFileSystem[0x12])(pIVar9,&local_60);
        ::std::__cxx11::string::_M_dispose();
      }
      plVar10 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
      if (plVar10 == (long *)0x0) {
        uVar16 = 0xffffffffffffffff;
        lVar11 = 0;
      }
      else {
        lVar11 = (**(code **)(*plVar10 + 0x40))(plVar10);
        uVar7 = (**(code **)*plVar10)(plVar10,0x12);
        uVar16 = (ulong)uVar7;
        iVar8 = (**(code **)(*plVar10 + 0x10))(plVar10,2);
      }
      iVar6 = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
      local_60.str._M_string_length._0_4_ = iVar6 + -4;
      local_60.str._M_string_length._4_4_ = iVar8 + 3;
      plVar5 = *(long **)&this->field_0x128;
      local_60.str._M_dataplus._M_p._4_4_ = 3;
      local_60.str._M_dataplus._M_p._0_4_ = (iVar6 - iVar8) + -4;
      if (plVar10 == (long *)0x0) {
        pwVar12 = L"Close";
      }
      else {
        pwVar12 = (wchar_t *)(**(code **)(*plVar10 + 0x18))(plVar10,4);
      }
      pIVar13 = (IGUIButton *)
                (**(code **)(*plVar5 + 0xb8))(plVar5,&local_60,this,0xffffffffffffffff,L"",pwVar12);
      this->CloseButton = pIVar13;
      (*(pIVar13->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x11])(pIVar13,1);
      this_00 = &this->CloseButton->super_IGUIElement;
      this_00->IsTabStop = false;
      if ((plVar10 != (long *)0x0) && (lVar11 != 0)) {
        (*(((IGUIElement *)&this_00->super_IEventReceiver)->super_IEventReceiver).
          _vptr_IEventReceiver[0x31])(this_00,lVar11);
        pIVar13 = this->CloseButton;
        uVar7 = (**(code **)(*plVar10 + 0x50))(plVar10,2);
        (*(pIVar13->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                  (pIVar13,0,(ulong)uVar7,uVar16 & 0xffffffff,0,0);
        pIVar13 = this->CloseButton;
        uVar7 = (**(code **)(*plVar10 + 0x50))(plVar10,2);
        (*(pIVar13->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                  (pIVar13,1,(ulong)uVar7,uVar16 & 0xffffffff,0,0);
        this_00 = &this->CloseButton->super_IGUIElement;
      }
      IGUIElement::setAlignment
                (this_00,EGUIA_LOWERRIGHT,EGUIA_LOWERRIGHT,EGUIA_UPPERLEFT,EGUIA_UPPERLEFT);
      pcVar1 = (this->CloseButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3]
               + 8 + (long)&(this->CloseButton->super_IGUIElement).Children.
                            super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
      ;
      *(int *)pcVar1 = *(int *)pcVar1 + 1;
      iVar8 = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
      plVar5 = *(long **)&this->field_0x128;
      local_60.str._M_string_length._0_4_ = iVar8 + -10;
      local_60.str._M_dataplus._M_p._4_4_ = 0x1e;
      local_60.str._M_dataplus._M_p._0_4_ = iVar8 + -0x50;
      local_60.str._M_string_length._4_4_ = 0x32;
      if (plVar10 == (long *)0x0) {
        pwVar12 = L"OK";
      }
      else {
        pwVar12 = (wchar_t *)(**(code **)(*plVar10 + 0x18))(plVar10,0);
      }
      pIVar13 = (IGUIButton *)
                (**(code **)(*plVar5 + 0xb8))(plVar5,&local_60,this,0xffffffffffffffff,pwVar12,0);
      this->OKButton = pIVar13;
      (*(pIVar13->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x11])(pIVar13,1);
      IGUIElement::setAlignment
                (&this->OKButton->super_IGUIElement,EGUIA_LOWERRIGHT,EGUIA_LOWERRIGHT,
                 EGUIA_UPPERLEFT,EGUIA_UPPERLEFT);
      pcVar1 = (this->OKButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] + 8
               + (long)&(this->OKButton->super_IGUIElement).Children.
                        super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
      ;
      *(int *)pcVar1 = *(int *)pcVar1 + 1;
      iVar8 = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
      plVar5 = *(long **)&this->field_0x128;
      local_60.str._M_string_length._0_4_ = iVar8 + -10;
      local_60.str._M_dataplus._M_p._4_4_ = 0x37;
      local_60.str._M_dataplus._M_p._0_4_ = iVar8 + -0x50;
      local_60.str._M_string_length._4_4_ = 0x4b;
      if (plVar10 == (long *)0x0) {
        pwVar12 = L"Cancel";
      }
      else {
        pwVar12 = (wchar_t *)(**(code **)(*plVar10 + 0x18))(plVar10,1);
      }
      pIVar13 = (IGUIButton *)
                (**(code **)(*plVar5 + 0xb8))(plVar5,&local_60,this,0xffffffff,pwVar12,0);
      this->CancelButton = pIVar13;
      (*(pIVar13->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x11])(pIVar13,1);
      IGUIElement::setAlignment
                (&this->CancelButton->super_IGUIElement,EGUIA_LOWERRIGHT,EGUIA_LOWERRIGHT,
                 EGUIA_UPPERLEFT,EGUIA_UPPERLEFT);
      pcVar1 = (this->CancelButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3]
               + 8 + (long)&(this->CancelButton->super_IGUIElement).Children.
                            super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
      ;
      *(int *)pcVar1 = *(int *)pcVar1 + 1;
      local_60.str._M_string_length._0_4_ =
           (*(int *)&this->field_0x38 - *(int *)&this->field_0x30) + -0x5a;
      local_60.str._M_dataplus._M_p = (pointer)0x370000000a;
      local_60.str._M_string_length._4_4_ = 0xe6;
      pIVar14 = (IGUIListBox *)
                (**(code **)(**(long **)&this->field_0x128 + 0xe0))
                          (*(long **)&this->field_0x128,&local_60,this,0xffffffff,1);
      this->FileBox = pIVar14;
      (*(pIVar14->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x11])(pIVar14);
      IGUIElement::setAlignment
                (&this->FileBox->super_IGUIElement,EGUIA_UPPERLEFT,EGUIA_LOWERRIGHT,EGUIA_UPPERLEFT,
                 EGUIA_LOWERRIGHT);
      pcVar1 = (this->FileBox->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] + 8
               + (long)&(this->FileBox->super_IGUIElement).Children.
                        super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
      ;
      *(int *)pcVar1 = *(int *)pcVar1 + 1;
      local_60.str._M_string_length._0_4_ =
           (*(int *)&this->field_0x38 - *(int *)&this->field_0x30) + -0x5a;
      local_60.str._M_dataplus._M_p = (pointer)0x1e0000000a;
      local_60.str._M_string_length._4_4_ = 0x32;
      pIVar15 = (IGUIEditBox *)
                (**(code **)(**(long **)&this->field_0x128 + 0xf8))
                          (*(long **)&this->field_0x128,0,&local_60,1,this,0xffffffff);
      this->FileNameText = pIVar15;
      (*(pIVar15->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x11])(pIVar15);
      IGUIElement::setAlignment
                (&this->FileNameText->super_IGUIElement,EGUIA_UPPERLEFT,EGUIA_LOWERRIGHT,
                 EGUIA_UPPERLEFT,EGUIA_UPPERLEFT);
      pcVar1 = (this->FileNameText->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3]
               + 8 + (long)&(this->FileNameText->super_IGUIElement).Children.
                            super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
      ;
      *(int *)pcVar1 = *(int *)pcVar1 + 1;
      this->field_0x114 = 1;
      fillListBox(this);
    }
  }
  return;
}

Assistant:

CGUIFileOpenDialog::CGUIFileOpenDialog(const wchar_t *title,
		IGUIEnvironment *environment, IGUIElement *parent, s32 id,
		bool restoreCWD, io::path::char_type *startDir) :
		IGUIFileOpenDialog(environment, parent, id,
				core::rect<s32>((parent->getAbsolutePosition().getWidth() - FOD_WIDTH) / 2,
						(parent->getAbsolutePosition().getHeight() - FOD_HEIGHT) / 2,
						(parent->getAbsolutePosition().getWidth() - FOD_WIDTH) / 2 + FOD_WIDTH,
						(parent->getAbsolutePosition().getHeight() - FOD_HEIGHT) / 2 + FOD_HEIGHT)),
		FileNameText(0), FileList(0), Dragging(false)
{
#ifdef _DEBUG
	IGUIElement::setDebugName("CGUIFileOpenDialog");
#endif

	Text = title;

	FileSystem = Environment ? Environment->getFileSystem() : 0;

	if (FileSystem) {
		FileSystem->grab();

		if (restoreCWD)
			RestoreDirectory = FileSystem->getWorkingDirectory();
		if (startDir) {
			StartDirectory = startDir;
			FileSystem->changeWorkingDirectoryTo(startDir);
		}
	} else
		return;

	IGUISpriteBank *sprites = 0;
	video::SColor color(255, 255, 255, 255);
	IGUISkin *skin = Environment->getSkin();
	if (skin) {
		sprites = skin->getSpriteBank();
		color = skin->getColor(EGDC_WINDOW_SYMBOL);
	}

	const s32 buttonw = skin ? skin->getSize(EGDS_WINDOW_BUTTON_WIDTH) : 2;
	const s32 posx = RelativeRect.getWidth() - buttonw - 4;

	CloseButton = Environment->addButton(core::rect<s32>(posx, 3, posx + buttonw, 3 + buttonw), this, -1,
			L"", skin ? skin->getDefaultText(EGDT_WINDOW_CLOSE) : L"Close");
	CloseButton->setSubElement(true);
	CloseButton->setTabStop(false);
	if (sprites && skin) {
		CloseButton->setSpriteBank(sprites);
		CloseButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_WINDOW_CLOSE), color);
		CloseButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_WINDOW_CLOSE), color);
	}
	CloseButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
	CloseButton->grab();

	OKButton = Environment->addButton(
			core::rect<s32>(RelativeRect.getWidth() - 80, 30, RelativeRect.getWidth() - 10, 50),
			this, -1, skin ? skin->getDefaultText(EGDT_MSG_BOX_OK) : L"OK");
	OKButton->setSubElement(true);
	OKButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
	OKButton->grab();

	CancelButton = Environment->addButton(
			core::rect<s32>(RelativeRect.getWidth() - 80, 55, RelativeRect.getWidth() - 10, 75),
			this, -1, skin ? skin->getDefaultText(EGDT_MSG_BOX_CANCEL) : L"Cancel");
	CancelButton->setSubElement(true);
	CancelButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
	CancelButton->grab();

	FileBox = Environment->addListBox(core::rect<s32>(10, 55, RelativeRect.getWidth() - 90, 230), this, -1, true);
	FileBox->setSubElement(true);
	FileBox->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT);
	FileBox->grab();

	FileNameText = Environment->addEditBox(0, core::rect<s32>(10, 30, RelativeRect.getWidth() - 90, 50), true, this);
	FileNameText->setSubElement(true);
	FileNameText->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
	FileNameText->grab();

	setTabGroup(true);

	fillListBox();
}